

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O0

string * __thiscall
Json::OurReader::getFormattedErrorMessages_abi_cxx11_
          (string *__return_storage_ptr__,OurReader *this)

{
  bool bVar1;
  string local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  string local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  reference local_68;
  ErrorInfo *error;
  undefined1 local_40 [8];
  const_iterator itError;
  OurReader *this_local;
  string *formattedMessage;
  
  itError._M_node._7_1_ = 0;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::deque<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_>::begin
            ((const_iterator *)local_40,&this->errors_);
  while( true ) {
    std::deque<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_>::end
              ((const_iterator *)&error,&this->errors_);
    bVar1 = std::operator!=((_Self *)local_40,(_Self *)&error);
    if (!bVar1) break;
    local_68 = std::
               _Deque_iterator<Json::OurReader::ErrorInfo,_const_Json::OurReader::ErrorInfo_&,_const_Json::OurReader::ErrorInfo_*>
               ::operator*((_Deque_iterator<Json::OurReader::ErrorInfo,_const_Json::OurReader::ErrorInfo_&,_const_Json::OurReader::ErrorInfo_*>
                            *)local_40);
    getLocationLineAndColumn_abi_cxx11_(&local_c8,this,(local_68->token_).start_);
    std::operator+(&local_a8,"* ",&local_c8);
    std::operator+(&local_88,&local_a8,"\n");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::operator+(&local_118,"  ",&local_68->message_);
    std::operator+(&local_f8,&local_118,"\n");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_118);
    if (local_68->extra_ != (Location)0x0) {
      getLocationLineAndColumn_abi_cxx11_(&local_178,this,local_68->extra_);
      std::operator+(&local_158,"See ",&local_178);
      std::operator+(&local_138,&local_158," for detail.\n");
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_138);
      std::__cxx11::string::~string((string *)&local_138);
      std::__cxx11::string::~string((string *)&local_158);
      std::__cxx11::string::~string((string *)&local_178);
    }
    std::
    _Deque_iterator<Json::OurReader::ErrorInfo,_const_Json::OurReader::ErrorInfo_&,_const_Json::OurReader::ErrorInfo_*>
    ::operator++((_Deque_iterator<Json::OurReader::ErrorInfo,_const_Json::OurReader::ErrorInfo_&,_const_Json::OurReader::ErrorInfo_*>
                  *)local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

JSONCPP_STRING OurReader::getFormattedErrorMessages() const {
  JSONCPP_STRING formattedMessage;
  for (Errors::const_iterator itError = errors_.begin();
       itError != errors_.end();
       ++itError) {
    const ErrorInfo& error = *itError;
    formattedMessage +=
        "* " + getLocationLineAndColumn(error.token_.start_) + "\n";
    formattedMessage += "  " + error.message_ + "\n";
    if (error.extra_)
      formattedMessage +=
          "See " + getLocationLineAndColumn(error.extra_) + " for detail.\n";
  }
  return formattedMessage;
}